

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O0

void __thiscall moira::Moira::setModel(Moira *this,Model cpuModel,Model dasmModel)

{
  u32 uVar1;
  Model dasmModel_local;
  Model cpuModel_local;
  Moira *this_local;
  
  if ((this->cpuModel != cpuModel) || (this->dasmModel != dasmModel)) {
    this->cpuModel = cpuModel;
    this->dasmModel = dasmModel;
    createJumpTable(this,cpuModel,dasmModel);
    uVar1 = cacrMask(this);
    (this->reg).cacr = uVar1 & (this->reg).cacr;
    this->flags = this->flags & 0xfffffffb;
  }
  return;
}

Assistant:

void
Moira::setModel(Model cpuModel, Model dasmModel)
{
    if (this->cpuModel != cpuModel || this->dasmModel != dasmModel) {
        
        this->cpuModel = cpuModel;
        this->dasmModel = dasmModel;

        createJumpTable(cpuModel, dasmModel);
        
        reg.cacr &= cacrMask();
        flags &= ~State::LOOPING;
    }
}